

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O2

void eepromtool(char *ifname,int slave,int mode,char *fname)

{
  undefined2 uVar1;
  uint16 uVar2;
  int iVar3;
  int iVar4;
  uint length;
  char *pcVar5;
  uint length_00;
  timeval tVar6;
  uint local_3c;
  int estart;
  int w;
  
  iVar3 = ec_init();
  if (iVar3 == 0) {
    printf("No socket connection on %s\nExcecute as root\n",ifname);
    return;
  }
  printf("ec_init on %s succeeded.\n",ifname);
  w = 0;
  wkc = ec_BRD(0,0,4,&w,20000);
  if (wkc < 1) {
    pcVar5 = "No slaves found!";
  }
  else {
    _ec_slavecount = wkc;
    printf("%d slaves found.\n");
    if ((slave < 1) || (_ec_slavecount < slave)) {
      pcVar5 = "Slave number outside range.";
    }
    else {
      if (((uint)mode < 7) && ((0x46U >> (mode & 0x1fU) & 1) != 0)) {
        gettimeofday((timeval *)&tstart,(__timezone_ptr_t)0x0);
        eeprom_read(slave,0,0x80);
        printf("Slave %d data\n",slave);
        printf(" PDI Control      : %4.4X\n",(ulong)(ushort)ebuf._0_2_);
        printf(" PDI Config       : %4.4X\n",(ulong)(ushort)ebuf._2_2_);
        printf(" Config Alias     : %4.4X\n",(ulong)(ushort)ebuf._8_2_);
        printf(" Checksum         : %4.4X\n",(ulong)(ushort)ebuf._14_2_);
        uVar2 = SIIcrc(ebuf);
        printf("   calculated     : %4.4X\n",(ulong)uVar2);
        printf(" Vendor ID        : %8.8X\n",(ulong)(uint)ebuf._16_4_);
        printf(" Product Code     : %8.8X\n",(ulong)(uint)ebuf._20_4_);
        printf(" Revision Number  : %8.8X\n",(ulong)(uint)ebuf._24_4_);
        printf(" Serial Number    : %8.8X\n",(ulong)(uint)ebuf._28_4_);
        printf(" Mailbox Protocol : %4.4X\n",(ulong)(ushort)ebuf._56_2_);
        uVar1 = ebuf._124_2_;
        length_00 = (uint)(ushort)ebuf._124_2_ << 7;
        if (0x7f7f < length_00) {
          length_00 = 0x7f80;
        }
        length = length_00 + 0x80;
        local_3c = length;
        printf(" Size             : %4.4X = %d bytes\n",(ulong)(uint)(ushort)ebuf._124_2_,
               (ulong)length);
        printf(" Version          : %4.4X\n");
        if (1 < mode - 1U) goto LAB_00102c42;
        if (uVar1 != 0) {
          eeprom_read(slave,0x80,length_00);
        }
        gettimeofday((timeval *)&tend,(__timezone_ptr_t)0x0);
        tdif.tv_sec = tend.tv_sec - tstart.tv_sec;
        tdif.tv_usec = tend.tv_usec - tstart.tv_usec;
        if (tdif.tv_usec < 0) {
          tdif.tv_sec = tdif.tv_sec + -1;
          tdif.tv_usec = tdif.tv_usec + 1000000;
        }
        if (mode == 2) {
          output_intelhex(fname,length);
        }
        else {
          output_bin(fname,length);
        }
        tVar6.tv_usec = tdif.tv_sec * 1000000 + tdif.tv_usec;
        pcVar5 = "\nTotal EEPROM read time :%ldms\n";
LAB_00102e1c:
        printf(pcVar5,tVar6.tv_usec / 1000,tVar6.tv_usec % 1000);
        goto LAB_00102c22;
      }
LAB_00102c42:
      if (mode - 3U < 2) {
        estart = 0;
        if (mode == 4) {
          iVar3 = input_intelhex(fname,&estart,(int *)&local_3c);
        }
        else {
          iVar3 = input_bin(fname,(int *)&local_3c);
        }
        if (iVar3 != 0) {
          printf("Slave %d\n",slave);
          printf(" Vendor ID        : %8.8X\n",(ulong)(uint)ebuf._16_4_);
          printf(" Product Code     : %8.8X\n",(ulong)(uint)ebuf._20_4_);
          printf(" Revision Number  : %8.8X\n",(ulong)(uint)ebuf._24_4_);
          printf(" Serial Number    : %8.8X\n");
          printf("Busy");
          fflush(_stdout);
          gettimeofday((timeval *)&tstart,(__timezone_ptr_t)0x0);
          eeprom_write(slave,estart,local_3c);
          gettimeofday((timeval *)&tend,(__timezone_ptr_t)0x0);
          tVar6.tv_sec = tend.tv_sec - tstart.tv_sec;
          tVar6.tv_usec = tend.tv_usec - tstart.tv_usec;
          tdif = tVar6;
          if (tVar6.tv_usec < 0) {
            tVar6.tv_sec = tVar6.tv_sec + -1;
            tVar6.tv_usec = tVar6.tv_usec + 1000000;
            tdif.tv_usec = tVar6.tv_usec;
            tdif.tv_sec = tVar6.tv_sec;
          }
          tVar6.tv_usec = tVar6.tv_sec * 1000000 + tVar6.tv_usec;
          pcVar5 = "\nTotal EEPROM write time :%ldms\n";
          goto LAB_00102e1c;
        }
        pcVar5 = "Error reading file, abort.";
      }
      else {
        if (mode != 5) goto LAB_00102c22;
        iVar4 = eeprom_read(slave,0,0xe);
        iVar3 = alias;
        if (iVar4 == 0) {
          printf("Could not read slave EEPROM");
          goto LAB_00102c22;
        }
        ebuf._8_2_ = (undefined2)alias;
        uVar2 = SIIcrc(ebuf);
        iVar3 = eeprom_writealias(slave,iVar3,uVar2);
        if (iVar3 != 0) {
          printf("Alias %4.4X written successfully to slave %d\n",(ulong)(uint)alias,slave);
          goto LAB_00102c22;
        }
        pcVar5 = "Alias not written";
      }
    }
  }
  puts(pcVar5);
LAB_00102c22:
  puts("End, close socket");
  ec_close();
  return;
}

Assistant:

void eepromtool(char *ifname, int slave, int mode, char *fname)
{
   int w, rc = 0, estart, esize;
   uint16 *wbuf;
   
   /* initialise SOEM, bind socket to ifname */
   if (ec_init(ifname))
   {   
      printf("ec_init on %s succeeded.\n",ifname);

      w = 0x0000;
       wkc = ec_BRD(0x0000, ECT_REG_TYPE, sizeof(w), &w, EC_TIMEOUTSAFE);      /* detect number of slaves */
       if (wkc > 0)
       {
         ec_slavecount = wkc;

         printf("%d slaves found.\n",ec_slavecount);
         if((ec_slavecount >= slave) && (slave > 0))
         {
            if ((mode == MODE_INFO) || (mode == MODE_READBIN) || (mode == MODE_READINTEL))
            {
               rc =  gettimeofday(&tstart, NULL);
               eeprom_read(slave, 0x0000, MINBUF); // read first 128 bytes

               wbuf = (uint16 *)&ebuf[0];
               printf("Slave %d data\n", slave);
               printf(" PDI Control      : %4.4X\n",*(wbuf + 0x00));
               printf(" PDI Config       : %4.4X\n",*(wbuf + 0x01));
               printf(" Config Alias     : %4.4X\n",*(wbuf + 0x04));
               printf(" Checksum         : %4.4X\n",*(wbuf + 0x07));
               printf("   calculated     : %4.4X\n",SIIcrc(&ebuf[0])); 
               printf(" Vendor ID        : %8.8X\n",*(uint32 *)(wbuf + 0x08));
               printf(" Product Code     : %8.8X\n",*(uint32 *)(wbuf + 0x0A));
               printf(" Revision Number  : %8.8X\n",*(uint32 *)(wbuf + 0x0C));
               printf(" Serial Number    : %8.8X\n",*(uint32 *)(wbuf + 0x0E));
               printf(" Mailbox Protocol : %4.4X\n",*(wbuf + 0x1C));
               esize = (*(wbuf + 0x3E) + 1) * 128;
               if (esize > MAXBUF) esize = MAXBUF;
               printf(" Size             : %4.4X = %d bytes\n",*(wbuf + 0x3E), esize);
               printf(" Version          : %4.4X\n",*(wbuf + 0x3F));
            }
            if ((mode == MODE_READBIN) || (mode == MODE_READINTEL))
            {
               if (esize > MINBUF)
                  eeprom_read(slave, MINBUF, esize - MINBUF); // read reminder

               rc =  gettimeofday(&tend, NULL);
               timersub(&tend, &tstart, &tdif);
               if (mode == MODE_READINTEL) output_intelhex(fname, esize);
               if (mode == MODE_READBIN)   output_bin(fname, esize);

               printf("\nTotal EEPROM read time :%ldms\n", (tdif.tv_usec+(tdif.tv_sec*1000000L)) / 1000);
            }
            if ((mode == MODE_WRITEBIN) || (mode == MODE_WRITEINTEL))
            {
               estart = 0;
               if (mode == MODE_WRITEINTEL) rc = input_intelhex(fname, &estart, &esize);
               if (mode == MODE_WRITEBIN)   rc = input_bin(fname, &esize);

               if (rc > 0)
               {               
                  wbuf = (uint16 *)&ebuf[0];
                  printf("Slave %d\n", slave);
                  printf(" Vendor ID        : %8.8X\n",*(uint32 *)(wbuf + 0x08));
                  printf(" Product Code     : %8.8X\n",*(uint32 *)(wbuf + 0x0A));
                  printf(" Revision Number  : %8.8X\n",*(uint32 *)(wbuf + 0x0C));
                  printf(" Serial Number    : %8.8X\n",*(uint32 *)(wbuf + 0x0E));

                  printf("Busy");
                  fflush(stdout);
                  rc =  gettimeofday(&tstart, NULL);
                  eeprom_write(slave, estart, esize);
                  rc =  gettimeofday(&tend, NULL);               
                  timersub(&tend, &tstart, &tdif);

                  printf("\nTotal EEPROM write time :%ldms\n", (tdif.tv_usec+(tdif.tv_sec*1000000L)) / 1000);
               }
               else
                  printf("Error reading file, abort.\n"); 
            }
            if (mode == MODE_WRITEALIAS)
            {
               if( eeprom_read(slave, 0x0000, CRCBUF) ) // read first 14 bytes
               {
                  wbuf = (uint16 *)&ebuf[0];
                  *(wbuf + 0x04) = alias;  
                  if(eeprom_writealias(slave, alias, SIIcrc(&ebuf[0])))
                  {
                     printf("Alias %4.4X written successfully to slave %d\n", alias, slave);
                  } 
                  else
                  {
                     printf("Alias not written\n");
                  }
               }  
               else
               {
                  printf("Could not read slave EEPROM");    
               }
            }
         }
         else
         {
            printf("Slave number outside range.\n");
         }
      }
      else
      {
         printf("No slaves found!\n");
      }
      printf("End, close socket\n");
      /* stop SOEM, close socket */
      ec_close();
   }
   else
   {
      printf("No socket connection on %s\nExcecute as root\n",ifname);
   }
}